

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Variable * __thiscall
soul::BlockBuilder::createVariable<soul::Identifier>
          (BlockBuilder *this,Type *type,Identifier *name,Role role)

{
  Module *m;
  Variable *pVVar1;
  Type local_40;
  Role local_24;
  Identifier *pIStack_20;
  Role role_local;
  Identifier *name_local;
  Type *type_local;
  BlockBuilder *this_local;
  
  m = this->module;
  local_24 = role;
  pIStack_20 = name;
  name_local = (Identifier *)type;
  type_local = (Type *)this;
  Type::Type(&local_40,type);
  pVVar1 = createVariable<soul::Identifier>(m,&local_40,pIStack_20,local_24);
  Type::~Type(&local_40);
  return pVVar1;
}

Assistant:

heart::Variable& createVariable (Type type, StringType&& name, heart::Variable::Role role)
    {
        return createVariable (module, std::move (type), std::move (name), role);
    }